

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O3

cio_error write_some_first_write_partial_at_element_boundary_second_error
                    (cio_io_stream *io_stream,cio_write_buffer *buf,
                    cio_io_stream_write_handler_t handler,void *handler_context)

{
  cio_write_buffer *pcVar1;
  size_t sVar2;
  cio_error cVar3;
  size_t sVar4;
  
  sVar2 = write_check_buffer_pos;
  if (write_some_fake.call_count == 2) {
    cVar3 = CIO_MESSAGE_TOO_LONG;
    sVar4 = 0;
  }
  else {
    if (write_some_fake.call_count != 1) {
      write_some_all(io_stream,buf,handler,handler_context);
      return CIO_SUCCESS;
    }
    pcVar1 = buf->next;
    if ((buf->data).head.q_len == 0) {
      sVar4 = (pcVar1->data).element.length;
    }
    else {
      memcpy(write_check_buffer + write_check_buffer_pos,(pcVar1->data).element.field_0.const_data,
             (pcVar1->data).element.length);
      sVar4 = (pcVar1->data).element.length;
      write_check_buffer_pos = sVar2 + sVar4;
    }
    cVar3 = CIO_SUCCESS;
  }
  (*handler)(io_stream,handler_context,buf,cVar3,sVar4);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error write_some_first_write_partial_at_element_boundary_second_error(struct cio_io_stream *io_stream, struct cio_write_buffer *buf, cio_io_stream_write_handler_t handler, void *handler_context)
{
	struct cio_write_buffer *wbh = buf;
	if (write_some_fake.call_count == 1) {
		struct cio_write_buffer *wb = buf->next;
		if (cio_write_buffer_get_num_buffer_elements(buf) >= 1) {
			memcpy(&write_check_buffer[write_check_buffer_pos], wb->data.element.const_data, wb->data.element.length);
			write_check_buffer_pos += wb->data.element.length;
		}

		handler(io_stream, handler_context, wbh, CIO_SUCCESS, wb->data.element.length);
	} else if (write_some_fake.call_count == 2) {
		handler(io_stream, handler_context, wbh, CIO_MESSAGE_TOO_LONG, 0);
	} else {
		write_some_all(io_stream, wbh, handler, handler_context);
	}

	return CIO_SUCCESS;
}